

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

cmLocalGenerator * __thiscall
cmGlobalGenerator::FindLocalGenerator(cmGlobalGenerator *this,string *start_dir)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  pointer ppcVar4;
  string sd;
  allocator local_59;
  cmLocalGenerator *local_58;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  ppcVar4 = (this->LocalGenerators).
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppcVar4 !=
      (this->LocalGenerators).
      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      pcVar3 = cmLocalGenerator::GetCurrentSourceDirectory(*ppcVar4);
      std::__cxx11::string::string((string *)&local_50,pcVar3,&local_59);
      if ((local_48 == start_dir->_M_string_length) &&
         ((local_48 == 0 ||
          (iVar2 = bcmp(local_50,(start_dir->_M_dataplus)._M_p,local_48), iVar2 == 0)))) {
        local_58 = *ppcVar4;
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      if (bVar1) {
        return local_58;
      }
      ppcVar4 = ppcVar4 + 1;
    } while (ppcVar4 !=
             (this->LocalGenerators).
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  return (cmLocalGenerator *)0x0;
}

Assistant:

void cmGlobalGenerator::FillExtensionToLanguageMap(const std::string& l,
                                                   cmMakefile* mf)
{
  std::string extensionsVar = std::string("CMAKE_") + std::string(l) +
    std::string("_SOURCE_FILE_EXTENSIONS");
  std::string exts = mf->GetSafeDefinition(extensionsVar);
  std::vector<std::string> extensionList;
  cmSystemTools::ExpandListArgument(exts, extensionList);
  for (std::vector<std::string>::iterator i = extensionList.begin();
       i != extensionList.end(); ++i) {
    this->ExtensionToLanguage[*i] = l;
  }
}